

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O3

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  long *plVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  uint32_t uVar13;
  long lVar14;
  ulong uVar15;
  char cVar16;
  BYTE *pBVar17;
  long *plVar18;
  int iVar19;
  ulong uVar20;
  BYTE *pBVar21;
  long lVar22;
  BYTE *pBVar23;
  long lVar24;
  char *pcVar25;
  long *plVar26;
  long *plVar27;
  ulong uVar28;
  char *pcVar29;
  char *pcVar30;
  BYTE *s;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  long *plVar34;
  BYTE *s_2;
  BYTE *pBVar35;
  long *plVar36;
  long *plVar37;
  uint uVar38;
  BYTE *e_1;
  U32 *hashTable;
  int local_c0;
  char *local_a8;
  char *local_a0;
  int local_58;
  
  if ((LZ4_stream->internal_donotuse).initCheck != 0) {
    return 0;
  }
  pBVar35 = (LZ4_stream->internal_donotuse).dictionary + (LZ4_stream->internal_donotuse).dictSize;
  pBVar23 = (BYTE *)source;
  if (pBVar35 < source) {
    pBVar23 = pBVar35;
  }
  if ((LZ4_stream->internal_donotuse).dictSize == 0) {
    pBVar23 = (BYTE *)source;
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,pBVar23);
  uVar31 = 1;
  if (1 < acceleration) {
    uVar31 = acceleration;
  }
  pBVar17 = (BYTE *)(source + inputSize);
  pBVar23 = (LZ4_stream->internal_donotuse).dictionary;
  if (pBVar17 < pBVar35 && pBVar23 < pBVar17) {
    local_58 = (int)pBVar17;
    uVar7 = (int)pBVar35 - local_58;
    uVar8 = 0x10000;
    if (uVar7 < 0x10000) {
      uVar8 = uVar7;
    }
    uVar33 = 0;
    if (3 < uVar7) {
      uVar33 = (ulong)uVar8;
    }
    (LZ4_stream->internal_donotuse).dictSize = (uint32_t)uVar33;
    pBVar23 = pBVar35 + -uVar33;
    (LZ4_stream->internal_donotuse).dictionary = pBVar23;
  }
  uVar8 = (LZ4_stream->internal_donotuse).dictSize;
  uVar33 = (ulong)uVar8;
  local_c0 = (int)dest;
  if (pBVar35 != (BYTE *)source) {
    if (uVar8 < 0x10000) {
      uVar7 = (LZ4_stream->internal_donotuse).currentOffset;
      uVar20 = (ulong)uVar7;
      if (uVar7 <= uVar8) goto LAB_001082c4;
      iVar19 = 0;
      if ((uint)inputSize < 0x7e000001) {
        pcVar30 = dest;
        plVar37 = (long *)source;
        if ((0xc < (uint)inputSize) &&
           (*(uint *)((long)LZ4_stream +
                     ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar7,
           inputSize != 0xd)) {
          plVar1 = (long *)(pBVar17 + -0xc);
          plVar26 = (long *)(pBVar17 + -5);
          lVar22 = (long)source - uVar20;
          plVar27 = (long *)(source + 2);
LAB_00108f36:
          lVar14 = *(long *)((long)plVar37 + 1);
          plVar34 = (long *)((long)plVar37 + 1);
          uVar8 = uVar31 & 0x3ffffff;
          uVar7 = uVar31 * 0x40;
          do {
            plVar18 = plVar27;
            uVar7 = uVar7 + 1;
            uVar15 = (ulong)uVar8;
            uVar28 = (ulong)(lVar14 * -0x30e4432345000000) >> 0x34;
            uVar9 = (ulong)*(uint *)((long)LZ4_stream + uVar28 * 4);
            pcVar25 = (char *)(uVar9 + lVar22);
            lVar14 = *plVar18;
            iVar19 = (int)lVar22;
            *(int *)((long)LZ4_stream + uVar28 * 4) = (int)plVar34 - iVar19;
            if ((source + -uVar33 <= pcVar25) && (plVar34 <= (long *)(uVar9 + lVar22 + 0xffff))) {
              pBVar35 = (BYTE *)0x0;
              if (pcVar25 < source) {
                pBVar35 = pBVar23 + (uVar33 - (long)source);
              }
              if (*(int *)(pcVar25 + (long)pBVar35) == (int)*plVar34) goto LAB_00108fc6;
            }
            uVar8 = uVar7 >> 6;
            plVar27 = (long *)(uVar15 + (long)plVar18);
            plVar34 = plVar18;
            if (plVar1 < (long *)(uVar15 + (long)plVar18)) break;
          } while( true );
        }
LAB_00108210:
        uVar33 = (long)pBVar17 - (long)plVar37;
        iVar19 = 0;
        if (pcVar30 + (uVar33 + 0xf0) / 0xff + (uVar33 - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (uVar33 < 0xf) {
            *pcVar30 = (char)uVar33 << 4;
          }
          else {
            uVar20 = uVar33 - 0xf;
            *pcVar30 = -0x10;
            pcVar25 = pcVar30 + 1;
            if (0xfe < uVar20) {
              uVar20 = (uVar33 - 0x10e) / 0xff;
              memset(pcVar25,0xff,uVar20 + 1);
              pcVar25 = pcVar30 + uVar20 + 2;
              uVar20 = (uVar33 + uVar20 * -0xff) - 0x10e;
            }
            *pcVar25 = (char)uVar20;
            pcVar30 = pcVar25;
          }
          memcpy(pcVar30 + 1,plVar37,uVar33);
          iVar19 = ((int)(pcVar30 + 1) + (int)uVar33) - local_c0;
        }
      }
    }
    else {
LAB_001082c4:
      iVar19 = 0;
      if ((uint)inputSize < 0x7e000001) {
        pcVar30 = dest;
        plVar37 = (long *)source;
        if (0xc < (uint)inputSize) {
          uVar20 = (ulong)(LZ4_stream->internal_donotuse).currentOffset;
          *(uint32_t *)
           ((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
               (LZ4_stream->internal_donotuse).currentOffset;
          if (inputSize != 0xd) {
            plVar1 = (long *)(pBVar17 + -0xc);
            plVar27 = (long *)(pBVar17 + -5);
            lVar22 = (long)source - uVar20;
            plVar26 = (long *)(source + 2);
LAB_0010860d:
            lVar14 = *(long *)((long)plVar37 + 1);
            plVar34 = (long *)((long)plVar37 + 1);
            uVar7 = uVar31 & 0x3ffffff;
            uVar8 = uVar31 * 0x40;
            do {
              plVar18 = plVar26;
              uVar8 = uVar8 + 1;
              uVar15 = (ulong)uVar7;
              uVar28 = (ulong)(lVar14 * -0x30e4432345000000) >> 0x34;
              uVar9 = (ulong)*(uint *)((long)LZ4_stream + uVar28 * 4);
              lVar14 = *plVar18;
              iVar19 = (int)lVar22;
              *(int *)((long)LZ4_stream + uVar28 * 4) = (int)plVar34 - iVar19;
              if (plVar34 <= (long *)(lVar22 + uVar9 + 0xffff)) {
                pcVar25 = (char *)(lVar22 + uVar9);
                pBVar35 = (BYTE *)0x0;
                if (pcVar25 < source) {
                  pBVar35 = pBVar23 + (uVar33 - (long)source);
                }
                if (*(int *)(pcVar25 + (long)pBVar35) == (int)*plVar34) goto LAB_00108694;
              }
              uVar7 = uVar8 >> 6;
              plVar26 = (long *)(uVar15 + (long)plVar18);
              plVar34 = plVar18;
              if (plVar1 < (long *)(uVar15 + (long)plVar18)) break;
            } while( true );
          }
        }
LAB_001082e7:
        uVar33 = (long)pBVar17 - (long)plVar37;
        iVar19 = 0;
        if (pcVar30 + (uVar33 + 0xf0) / 0xff + (uVar33 - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (uVar33 < 0xf) {
            *pcVar30 = (char)uVar33 << 4;
          }
          else {
            uVar20 = uVar33 - 0xf;
            *pcVar30 = -0x10;
            pcVar25 = pcVar30 + 1;
            if (0xfe < uVar20) {
              uVar20 = (uVar33 - 0x10e) / 0xff;
              memset(pcVar25,0xff,uVar20 + 1);
              pcVar25 = pcVar30 + uVar20 + 2;
              uVar20 = (uVar33 + uVar20 * -0xff) - 0x10e;
            }
            *pcVar25 = (char)uVar20;
            pcVar30 = pcVar25;
          }
          memcpy(pcVar30 + 1,plVar37,uVar33);
          iVar19 = ((int)(pcVar30 + 1) + (int)uVar33) - local_c0;
        }
      }
    }
LAB_00109832:
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
    uVar13 = inputSize;
    goto LAB_0010983d;
  }
  if (uVar8 < 0x10000) {
    uVar7 = (LZ4_stream->internal_donotuse).currentOffset;
    if (uVar8 < uVar7) {
      iVar19 = 0;
      if ((uint)inputSize < 0x7e000001) {
        plVar37 = (long *)source;
        pcVar30 = dest;
        if ((0xc < (uint)inputSize) &&
           (*(uint *)((long)LZ4_stream +
                     ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar7,
           inputSize != 0xd)) {
          piVar10 = (int *)(source + -uVar33);
          plVar1 = (long *)(pBVar17 + -0xc);
          pcVar25 = dest + maxOutputSize;
          lVar22 = (long)source - (ulong)uVar7;
          plVar26 = (long *)(source + 2);
          do {
            lVar14 = *(long *)((long)plVar37 + 1);
            plVar27 = (long *)((long)plVar37 + 1);
            uVar8 = uVar31 & 0x3ffffff;
            uVar11 = uVar31 * 0x40;
            while( true ) {
              uVar11 = uVar11 + 1;
              uVar33 = (ulong)(lVar14 * -0x30e4432345000000) >> 0x34;
              uVar3 = *(uint *)((long)LZ4_stream + uVar33 * 4);
              uVar20 = (ulong)uVar3;
              lVar14 = *plVar26;
              iVar32 = (int)plVar27;
              iVar19 = (int)lVar22;
              *(int *)((long)LZ4_stream + uVar33 * 4) = iVar32 - iVar19;
              if (((piVar10 <= (int *)(lVar22 + uVar20)) &&
                  (plVar27 <= (long *)(uVar20 + 0xffff + lVar22))) &&
                 (*(int *)(lVar22 + uVar20) == (int)*plVar27)) break;
              plVar34 = (long *)((ulong)uVar8 + (long)plVar26);
              uVar8 = uVar11 >> 6;
              plVar27 = plVar26;
              plVar26 = plVar34;
              if (plVar1 < plVar34) goto LAB_001083ce;
            }
            iVar12 = iVar32 - (int)plVar37;
            lVar14 = uVar20 - uVar7;
            lVar5 = 0;
            uVar8 = iVar12 - 0xfU;
            cVar6 = (char)plVar27 * '\x10' + (char)plVar37 * -0x10;
            do {
              cVar16 = cVar6;
              uVar11 = uVar8;
              lVar24 = lVar5;
              plVar26 = (long *)((long)plVar27 + lVar24);
              if ((source + lVar24 + lVar14 <= piVar10) || (plVar26 <= plVar37)) break;
              lVar5 = lVar24 + -1;
              uVar8 = uVar11 - 1;
              cVar6 = cVar16 + -0x10;
            } while (*(char *)((long)plVar27 + lVar24 + -1) == source[lVar24 + lVar14 + -1]);
            iVar4 = (int)lVar24;
            uVar33 = (ulong)(uint)(iVar4 + (iVar32 - (int)plVar37));
            if (pcVar25 < pcVar30 + (ulong)(uint)(iVar12 + iVar4) / 0xff + uVar33 + 9)
            goto LAB_00109888;
            plVar34 = (long *)(pcVar30 + 1);
            if ((uint)(iVar12 + iVar4) < 0xf) {
              *pcVar30 = cVar16;
            }
            else {
              uVar20 = (ulong)(iVar12 - 0xfU) + lVar24;
              *pcVar30 = -0x10;
              if (0xfe < (int)uVar20) {
                uVar8 = 0x1fd;
                if (uVar11 < 0x1fd) {
                  uVar8 = uVar11;
                }
                if (0x1fc < (int)uVar11) {
                  uVar11 = 0x1fd;
                }
                memset(plVar34,0xff,(ulong)((((iVar12 + 0xef) - uVar8) + iVar4) / 0xff + 1));
                uVar8 = ((iVar12 + 0xef) - uVar11) + iVar4;
                plVar34 = (long *)(pcVar30 + (ulong)uVar8 / 0xff + 2);
                uVar20 = (ulong)(iVar12 + -0x10e + iVar4 + uVar8 / 0xff);
              }
              *(char *)plVar34 = (char)uVar20;
              plVar34 = (long *)((long)plVar34 + 1);
            }
            plVar18 = (long *)(uVar33 + (long)plVar34);
            do {
              *plVar34 = *plVar37;
              plVar34 = plVar34 + 1;
              plVar37 = plVar37 + 1;
            } while (plVar34 < plVar18);
            *(short *)plVar18 = ((short)plVar26 - (short)lVar24) - ((short)uVar3 + (short)lVar22);
            uVar8 = LZ4_count((BYTE *)((long)plVar27 + lVar24 + 4),
                              (BYTE *)(source + lVar24 + lVar14 + 4),pBVar17 + -5);
            if (pcVar25 < (char *)((long)plVar18 + (ulong)(uVar8 >> 8) + 8)) goto LAB_00109875;
            plVar37 = (long *)((long)plVar26 + (ulong)(uVar8 + 4));
            pcVar29 = pcVar30;
            while( true ) {
              pcVar30 = (char *)((long)plVar18 + 2);
              if (uVar8 < 0xf) {
                *pcVar29 = *pcVar29 + (char)uVar8;
              }
              else {
                *pcVar29 = *pcVar29 + '\x0f';
                uVar11 = uVar8 - 0xf;
                pcVar30[0] = -1;
                pcVar30[1] = -1;
                pcVar30[2] = -1;
                pcVar30[3] = -1;
                if (0x3fb < uVar11) {
                  uVar33 = (ulong)(((uVar8 - 0x40b) / 0x3fc) * 4);
                  memset((char *)((long)plVar18 + 6),0xff,uVar33 + 4);
                  uVar11 = (uVar8 - 0x40b) % 0x3fc;
                  pcVar30 = (char *)((long)plVar18 + uVar33 + 6);
                }
                uVar8 = (uVar11 & 0xffff) / 0xff;
                pcVar29 = pcVar30 + uVar8;
                pcVar30 = pcVar29 + 1;
                *pcVar29 = (char)uVar8 + (char)uVar11;
              }
              if (plVar1 < plVar37) goto LAB_001083ce;
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)((long)plVar37 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)plVar37 + -2) - iVar19;
              uVar20 = (ulong)(*plVar37 * -0x30e4432345000000) >> 0x34;
              uVar33 = (ulong)*(uint *)((long)LZ4_stream + uVar20 * 4);
              piVar2 = (int *)(uVar33 + lVar22);
              *(int *)((long)LZ4_stream + uVar20 * 4) = (int)plVar37 - iVar19;
              if (((piVar2 < piVar10) || ((long *)(uVar33 + lVar22 + 0xffff) < plVar37)) ||
                 (*piVar2 != (int)*plVar37)) break;
              plVar18 = (long *)(pcVar30 + 1);
              *pcVar30 = '\0';
              *(short *)(pcVar30 + 1) = (short)plVar37 - (short)piVar2;
              uVar8 = LZ4_count((BYTE *)((long)plVar37 + 4),(BYTE *)(piVar2 + 1),pBVar17 + -5);
              plVar37 = (long *)((long)plVar37 + (ulong)(uVar8 + 4));
              pcVar29 = pcVar30;
              if (pcVar25 < pcVar30 + (ulong)(uVar8 >> 8) + 9) goto LAB_00109875;
            }
            plVar26 = (long *)((long)plVar37 + 2);
          } while (plVar26 <= plVar1);
        }
LAB_001083ce:
        uVar33 = (long)pBVar17 - (long)plVar37;
        iVar19 = 0;
        if (pcVar30 + (uVar33 + 0xf0) / 0xff + (uVar33 - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (uVar33 < 0xf) {
            *pcVar30 = (char)uVar33 << 4;
          }
          else {
            uVar20 = uVar33 - 0xf;
            *pcVar30 = -0x10;
            pcVar25 = pcVar30 + 1;
            if (0xfe < uVar20) {
              uVar20 = (uVar33 - 0x10e) / 0xff;
              memset(pcVar25,0xff,uVar20 + 1);
              pcVar25 = pcVar30 + uVar20 + 2;
              uVar20 = (uVar33 + uVar20 * -0xff) - 0x10e;
            }
            *pcVar25 = (char)uVar20;
            pcVar30 = pcVar25;
          }
          memcpy(pcVar30 + 1,plVar37,uVar33);
          iVar19 = ((int)(pcVar30 + 1) + (int)uVar33) - local_c0;
        }
      }
      goto LAB_001097f4;
    }
  }
  iVar19 = 0;
  if ((uint)inputSize < 0x7e000001) {
    pcVar30 = dest;
    plVar37 = (long *)source;
    if (0xc < (uint)inputSize) {
      uVar8 = (LZ4_stream->internal_donotuse).currentOffset;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar8;
      if (inputSize != 0xd) {
        plVar1 = (long *)(pBVar17 + -0xc);
        pcVar25 = dest + maxOutputSize;
        lVar22 = (long)source - (ulong)uVar8;
        plVar26 = (long *)(source + 2);
        do {
          lVar14 = *(long *)((long)plVar37 + 1);
          plVar27 = (long *)((long)plVar37 + 1);
          uVar7 = uVar31 & 0x3ffffff;
          uVar11 = uVar31 * 0x40;
          while( true ) {
            plVar34 = plVar26;
            uVar11 = uVar11 + 1;
            uVar20 = (ulong)(lVar14 * -0x30e4432345000000) >> 0x34;
            uVar3 = *(uint *)((long)LZ4_stream + uVar20 * 4);
            uVar9 = (ulong)uVar3;
            lVar14 = *plVar34;
            iVar19 = (int)plVar27;
            iVar32 = (int)lVar22;
            *(int *)((long)LZ4_stream + uVar20 * 4) = iVar19 - iVar32;
            if ((plVar27 <= (long *)(lVar22 + uVar9 + 0xffff)) &&
               (*(int *)(lVar22 + uVar9) == (int)*plVar27)) break;
            uVar20 = (ulong)uVar7;
            uVar7 = uVar11 >> 6;
            plVar26 = (long *)(uVar20 + (long)plVar34);
            plVar27 = plVar34;
            if (plVar1 < (long *)(uVar20 + (long)plVar34)) goto LAB_001084a1;
          }
          uVar11 = iVar19 - (int)plVar37;
          lVar14 = uVar9 - uVar8;
          lVar5 = 0;
          uVar7 = uVar11 - 0xf;
          cVar6 = (char)plVar27 * '\x10' + (char)plVar37 * -0x10;
          do {
            cVar16 = cVar6;
            uVar38 = uVar7;
            lVar24 = lVar5;
            plVar26 = (long *)((long)plVar27 + lVar24);
            if ((source + lVar24 + lVar14 <= source + -uVar33) || (plVar26 <= plVar37)) break;
            lVar5 = lVar24 + -1;
            uVar7 = uVar38 - 1;
            cVar6 = cVar16 + -0x10;
          } while (*(char *)((long)plVar27 + lVar24 + -1) == source[lVar24 + lVar14 + -1]);
          iVar12 = (int)lVar24;
          uVar20 = (ulong)(uint)(iVar12 + (iVar19 - (int)plVar37));
          if (pcVar25 < pcVar30 + ((ulong)uVar11 + lVar24 & 0xffffffff) / 0xff + uVar20 + 9)
          goto LAB_00109888;
          plVar34 = (long *)(pcVar30 + 1);
          if ((uint)((ulong)uVar11 + lVar24) < 0xf) {
            *pcVar30 = cVar16;
          }
          else {
            uVar9 = (ulong)(uVar11 - 0xf) + lVar24;
            *pcVar30 = -0x10;
            if (0xfe < (int)uVar9) {
              uVar7 = 0x1fd;
              if (uVar38 < 0x1fd) {
                uVar7 = uVar38;
              }
              if (0x1fc < (int)uVar38) {
                uVar38 = 0x1fd;
              }
              memset(plVar34,0xff,(ulong)((((uVar11 + 0xef) - uVar7) + iVar12) / 0xff + 1));
              uVar7 = ((uVar11 + 0xef) - uVar38) + iVar12;
              plVar34 = (long *)(pcVar30 + (ulong)uVar7 / 0xff + 2);
              uVar9 = (ulong)((uVar11 - 0x10e) + iVar12 + uVar7 / 0xff);
            }
            *(char *)plVar34 = (char)uVar9;
            plVar34 = (long *)((long)plVar34 + 1);
          }
          plVar18 = (long *)(uVar20 + (long)plVar34);
          do {
            *plVar34 = *plVar37;
            plVar34 = plVar34 + 1;
            plVar37 = plVar37 + 1;
          } while (plVar34 < plVar18);
          *(short *)plVar18 = ((short)plVar26 - (short)lVar24) - ((short)uVar3 + (short)lVar22);
          uVar7 = LZ4_count((BYTE *)((long)plVar27 + lVar24 + 4),
                            (BYTE *)(source + lVar24 + lVar14 + 4),pBVar17 + -5);
          if (pcVar25 < (char *)((long)plVar18 + (ulong)(uVar7 >> 8) + 8)) goto LAB_00109875;
          plVar37 = (long *)((long)plVar26 + (ulong)(uVar7 + 4));
          while( true ) {
            pcVar29 = (char *)((long)plVar18 + 2);
            if (uVar7 < 0xf) {
              *pcVar30 = *pcVar30 + (char)uVar7;
              pcVar30 = pcVar29;
            }
            else {
              *pcVar30 = *pcVar30 + '\x0f';
              uVar11 = uVar7 - 0xf;
              pcVar29[0] = -1;
              pcVar29[1] = -1;
              pcVar29[2] = -1;
              pcVar29[3] = -1;
              if (0x3fb < uVar11) {
                uVar20 = (ulong)(((uVar7 - 0x40b) / 0x3fc) * 4);
                memset((char *)((long)plVar18 + 6),0xff,uVar20 + 4);
                uVar11 = (uVar7 - 0x40b) % 0x3fc;
                pcVar29 = (char *)((long)plVar18 + uVar20 + 6);
              }
              uVar7 = (uVar11 & 0xffff) / 0xff;
              pcVar29[uVar7] = (char)uVar7 + (char)uVar11;
              pcVar30 = pcVar29 + uVar7 + 1;
            }
            if (plVar1 < plVar37) goto LAB_001084a1;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)((long)plVar37 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)plVar37 + -2) - iVar32;
            uVar20 = (ulong)(*plVar37 * -0x30e4432345000000) >> 0x34;
            uVar9 = (ulong)*(uint *)((long)LZ4_stream + uVar20 * 4);
            *(int *)((long)LZ4_stream + uVar20 * 4) = (int)plVar37 - iVar32;
            if (((long *)(lVar22 + uVar9 + 0xffff) < plVar37) ||
               (piVar10 = (int *)(uVar9 + lVar22), *piVar10 != (int)*plVar37)) break;
            plVar18 = (long *)(pcVar30 + 1);
            *pcVar30 = '\0';
            *(short *)(pcVar30 + 1) = (short)plVar37 - (short)piVar10;
            uVar7 = LZ4_count((BYTE *)((long)plVar37 + 4),(BYTE *)(piVar10 + 1),pBVar17 + -5);
            plVar37 = (long *)((long)plVar37 + (ulong)(uVar7 + 4));
            if (pcVar25 < pcVar30 + (ulong)(uVar7 >> 8) + 9) goto LAB_00109875;
          }
          plVar26 = (long *)((long)plVar37 + 2);
        } while (plVar26 <= plVar1);
      }
    }
LAB_001084a1:
    uVar33 = (long)pBVar17 - (long)plVar37;
    iVar19 = 0;
    if (pcVar30 + (uVar33 + 0xf0) / 0xff + (uVar33 - (long)dest) + 1 <=
        (char *)(ulong)(uint)maxOutputSize) {
      if (uVar33 < 0xf) {
        *pcVar30 = (char)uVar33 << 4;
      }
      else {
        uVar20 = uVar33 - 0xf;
        *pcVar30 = -0x10;
        pcVar25 = pcVar30 + 1;
        if (0xfe < uVar20) {
          uVar20 = (uVar33 - 0x10e) / 0xff;
          memset(pcVar25,0xff,uVar20 + 1);
          pcVar25 = pcVar30 + uVar20 + 2;
          uVar20 = (uVar33 + uVar20 * -0xff) - 0x10e;
        }
        *pcVar25 = (char)uVar20;
        pcVar30 = pcVar25;
      }
      memcpy(pcVar30 + 1,plVar37,uVar33);
      iVar19 = ((int)(pcVar30 + 1) + (int)uVar33) - local_c0;
    }
  }
LAB_001097f4:
  uVar13 = (LZ4_stream->internal_donotuse).dictSize + inputSize;
LAB_0010983d:
  (LZ4_stream->internal_donotuse).dictSize = uVar13;
  (LZ4_stream->internal_donotuse).currentOffset =
       (LZ4_stream->internal_donotuse).currentOffset + inputSize;
  return iVar19;
LAB_00109888:
  iVar19 = 0;
  goto LAB_001097f4;
LAB_00109875:
  iVar19 = 0;
  goto LAB_001097f4;
LAB_00108fc6:
  pBVar21 = (BYTE *)source;
  if (pcVar25 < source) {
    pBVar21 = pBVar23;
  }
  if ((plVar37 < plVar34) && (pBVar21 < pcVar25 + (long)pBVar35)) {
    lVar14 = 0;
    do {
      if (*(char *)((long)plVar34 + lVar14 + -1) !=
          source[(long)(pBVar35 + lVar14 + ~uVar20 + uVar9)]) {
        lVar5 = lVar14 + (uVar9 - uVar20);
        goto LAB_0010903a;
      }
      lVar24 = lVar14 + -1;
    } while ((plVar37 < (long *)((long)plVar34 + lVar14 + -1)) &&
            (lVar5 = lVar14 + ~uVar20 + uVar9, lVar14 = lVar24,
            pBVar21 < source + (long)(pBVar35 + lVar5)));
    lVar5 = lVar24 + (uVar9 - uVar20);
    lVar14 = lVar24;
LAB_0010903a:
    pcVar25 = source + lVar5;
    plVar34 = (long *)((long)plVar34 + lVar14);
  }
  uVar9 = (long)plVar34 - (long)plVar37;
  uVar15 = uVar9 & 0xffffffff;
  if (pcVar30 + uVar15 / 0xff + uVar15 + 9 <= dest + maxOutputSize) {
    plVar27 = (long *)(pcVar30 + 1);
    if ((uint)uVar9 < 0xf) {
      *pcVar30 = (char)uVar9 << 4;
    }
    else {
      uVar8 = (uint)uVar9 - 0xf;
      *pcVar30 = -0x10;
      if (0xfe < (int)uVar8) {
        if (0x1fc < uVar8) {
          uVar8 = 0x1fd;
        }
        uVar9 = (ulong)(((int)plVar34 - (uVar8 + (int)plVar37)) + 0xef) / 0xff;
        memset(plVar27,0xff,uVar9 + 1);
        plVar27 = (long *)(pcVar30 + uVar9 + 2);
        uVar8 = (((int)plVar34 - (int)plVar37) + (int)uVar9 * -0xff) - 0x10e;
      }
      *(char *)plVar27 = (char)uVar8;
      plVar27 = (long *)((long)plVar27 + 1);
    }
    plVar18 = (long *)(uVar15 + (long)plVar27);
    plVar36 = plVar37;
    do {
      *plVar27 = *plVar36;
      plVar27 = plVar27 + 1;
      plVar36 = plVar36 + 1;
      plVar37 = plVar34;
      local_a8 = pcVar30;
    } while (plVar27 < plVar18);
    do {
      *(short *)plVar18 = (short)plVar37 - (short)pcVar25;
      if (pBVar21 == pBVar23) {
        plVar27 = (long *)(pBVar23 + (uVar33 - (long)(pcVar25 + (long)pBVar35)) + (long)plVar37);
        if (plVar26 < pBVar23 + (uVar33 - (long)(pcVar25 + (long)pBVar35)) + (long)plVar37) {
          plVar27 = plVar26;
        }
        uVar8 = LZ4_count((BYTE *)((long)plVar37 + 4),(BYTE *)(pcVar25 + (long)(pBVar35 + 4)),
                          (BYTE *)plVar27);
        plVar37 = (long *)((long)plVar37 + (ulong)(uVar8 + 4));
        if (plVar37 == plVar27) {
          uVar7 = LZ4_count((BYTE *)plVar37,(BYTE *)source,(BYTE *)plVar26);
          uVar8 = uVar8 + uVar7;
          goto LAB_0010915e;
        }
      }
      else {
        uVar8 = LZ4_count((BYTE *)((long)plVar37 + 4),(BYTE *)(pcVar25 + 4),(BYTE *)plVar26);
        uVar7 = uVar8 + 4;
LAB_0010915e:
        plVar37 = (long *)((long)plVar37 + (ulong)uVar7);
      }
      if (dest + maxOutputSize < (char *)((long)plVar18 + (ulong)(uVar8 >> 8) + 8)) {
        iVar19 = 0;
        goto LAB_00109832;
      }
      pcVar30 = (char *)((long)plVar18 + 2);
      if (uVar8 < 0xf) {
        *local_a8 = *local_a8 + (char)uVar8;
      }
      else {
        *local_a8 = *local_a8 + '\x0f';
        uVar7 = uVar8 - 0xf;
        pcVar30[0] = -1;
        pcVar30[1] = -1;
        pcVar30[2] = -1;
        pcVar30[3] = -1;
        if (0x3fb < uVar7) {
          uVar9 = (ulong)(((uVar8 - 0x40b) / 0x3fc) * 4);
          memset((char *)((long)plVar18 + 6),0xff,uVar9 + 4);
          uVar7 = (uVar8 - 0x40b) % 0x3fc;
          pcVar30 = (char *)((long)plVar18 + uVar9 + 6);
        }
        uVar8 = (uVar7 & 0xffff) / 0xff;
        pcVar25 = pcVar30 + uVar8;
        pcVar30 = pcVar25 + 1;
        *pcVar25 = (char)uVar8 + (char)uVar7;
      }
      if (plVar1 < plVar37) goto LAB_00108210;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)plVar37 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)plVar37 + -2) - iVar19;
      uVar15 = (ulong)(*plVar37 * -0x30e4432345000000) >> 0x34;
      uVar9 = (ulong)*(uint *)((long)LZ4_stream + uVar15 * 4);
      pcVar25 = (char *)(uVar9 + lVar22);
      pBVar21 = (BYTE *)source;
      pBVar35 = (BYTE *)0x0;
      if (pcVar25 < source) {
        pBVar21 = pBVar23;
        pBVar35 = pBVar23 + (uVar33 - (long)source);
      }
      *(int *)((long)LZ4_stream + uVar15 * 4) = (int)plVar37 - iVar19;
      if (((pcVar25 < source + -uVar33) || ((long *)(uVar9 + lVar22 + 0xffff) < plVar37)) ||
         (*(int *)(pcVar25 + (long)pBVar35) != (int)*plVar37)) goto LAB_00109303;
      plVar18 = (long *)(pcVar30 + 1);
      *pcVar30 = '\0';
      local_a8 = pcVar30;
    } while( true );
  }
  goto LAB_00109884;
LAB_00109303:
  plVar27 = (long *)((long)plVar37 + 2);
  if (plVar1 < plVar27) goto LAB_00108210;
  goto LAB_00108f36;
LAB_00108694:
  pBVar21 = (BYTE *)source;
  if (pcVar25 < source) {
    pBVar21 = pBVar23;
  }
  if ((plVar37 < plVar34) && (pBVar21 < pcVar25 + (long)pBVar35)) {
    lVar14 = 0;
    do {
      if (*(char *)((long)plVar34 + lVar14 + -1) !=
          source[(long)(pBVar35 + lVar14 + ~uVar20 + uVar9)]) {
        lVar5 = lVar14 + (uVar9 - uVar20);
        goto LAB_00108708;
      }
      lVar24 = lVar14 + -1;
    } while ((plVar37 < (long *)((long)plVar34 + lVar14 + -1)) &&
            (lVar5 = lVar14 + ~uVar20 + uVar9, lVar14 = lVar24,
            pBVar21 < source + (long)(pBVar35 + lVar5)));
    lVar5 = lVar24 + (uVar9 - uVar20);
    lVar14 = lVar24;
LAB_00108708:
    pcVar25 = source + lVar5;
    plVar34 = (long *)((long)plVar34 + lVar14);
  }
  uVar9 = (long)plVar34 - (long)plVar37;
  uVar15 = uVar9 & 0xffffffff;
  if (pcVar30 + uVar15 / 0xff + uVar15 + 9 <= dest + maxOutputSize) {
    plVar26 = (long *)(pcVar30 + 1);
    if ((uint)uVar9 < 0xf) {
      *pcVar30 = (char)uVar9 << 4;
    }
    else {
      uVar8 = (uint)uVar9 - 0xf;
      *pcVar30 = -0x10;
      if (0xfe < (int)uVar8) {
        if (0x1fc < uVar8) {
          uVar8 = 0x1fd;
        }
        uVar9 = (ulong)(((int)plVar34 - (uVar8 + (int)plVar37)) + 0xef) / 0xff;
        memset(plVar26,0xff,uVar9 + 1);
        plVar26 = (long *)(pcVar30 + uVar9 + 2);
        uVar8 = (((int)plVar34 - (int)plVar37) + (int)uVar9 * -0xff) - 0x10e;
      }
      *(char *)plVar26 = (char)uVar8;
      plVar26 = (long *)((long)plVar26 + 1);
    }
    plVar18 = (long *)(uVar15 + (long)plVar26);
    plVar36 = plVar37;
    do {
      *plVar26 = *plVar36;
      plVar26 = plVar26 + 1;
      plVar36 = plVar36 + 1;
      plVar37 = plVar34;
      local_a0 = pcVar30;
    } while (plVar26 < plVar18);
    do {
      *(short *)plVar18 = (short)plVar37 - (short)pcVar25;
      if (pBVar21 == pBVar23) {
        plVar26 = (long *)(pBVar23 + (uVar33 - (long)(pcVar25 + (long)pBVar35)) + (long)plVar37);
        if (plVar27 < pBVar23 + (uVar33 - (long)(pcVar25 + (long)pBVar35)) + (long)plVar37) {
          plVar26 = plVar27;
        }
        uVar8 = LZ4_count((BYTE *)((long)plVar37 + 4),(BYTE *)(pcVar25 + (long)(pBVar35 + 4)),
                          (BYTE *)plVar26);
        plVar37 = (long *)((long)plVar37 + (ulong)(uVar8 + 4));
        if (plVar37 == plVar26) {
          uVar7 = LZ4_count((BYTE *)plVar37,(BYTE *)source,(BYTE *)plVar27);
          uVar8 = uVar8 + uVar7;
          goto LAB_0010882e;
        }
      }
      else {
        uVar8 = LZ4_count((BYTE *)((long)plVar37 + 4),(BYTE *)(pcVar25 + 4),(BYTE *)plVar27);
        uVar7 = uVar8 + 4;
LAB_0010882e:
        plVar37 = (long *)((long)plVar37 + (ulong)uVar7);
      }
      if (dest + maxOutputSize < (char *)((long)plVar18 + (ulong)(uVar8 >> 8) + 8)) {
        iVar19 = 0;
        goto LAB_00109832;
      }
      pcVar30 = (char *)((long)plVar18 + 2);
      if (uVar8 < 0xf) {
        *local_a0 = *local_a0 + (char)uVar8;
      }
      else {
        *local_a0 = *local_a0 + '\x0f';
        uVar7 = uVar8 - 0xf;
        pcVar30[0] = -1;
        pcVar30[1] = -1;
        pcVar30[2] = -1;
        pcVar30[3] = -1;
        if (0x3fb < uVar7) {
          uVar9 = (ulong)(((uVar8 - 0x40b) / 0x3fc) * 4);
          memset((char *)((long)plVar18 + 6),0xff,uVar9 + 4);
          uVar7 = (uVar8 - 0x40b) % 0x3fc;
          pcVar30 = (char *)(uVar9 + 6 + (long)plVar18);
        }
        uVar8 = (uVar7 & 0xffff) / 0xff;
        pcVar25 = pcVar30 + uVar8;
        pcVar30 = pcVar25 + 1;
        *pcVar25 = (char)uVar8 + (char)uVar7;
      }
      if (plVar1 < plVar37) goto LAB_001082e7;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)plVar37 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)plVar37 + -2) - iVar19;
      uVar9 = (ulong)(*plVar37 * -0x30e4432345000000) >> 0x34;
      uVar15 = (ulong)*(uint *)((long)LZ4_stream + uVar9 * 4);
      pcVar25 = (char *)(lVar22 + uVar15);
      pBVar21 = (BYTE *)source;
      pBVar35 = (BYTE *)0x0;
      if (pcVar25 < source) {
        pBVar21 = pBVar23;
        pBVar35 = pBVar23 + (uVar33 - (long)source);
      }
      *(int *)((long)LZ4_stream + uVar9 * 4) = (int)plVar37 - iVar19;
      if (((long *)(lVar22 + uVar15 + 0xffff) < plVar37) ||
         (*(int *)(pcVar25 + (long)pBVar35) != (int)*plVar37)) goto LAB_001089e0;
      plVar18 = (long *)(pcVar30 + 1);
      *pcVar30 = '\0';
      local_a0 = pcVar30;
    } while( true );
  }
LAB_00109884:
  iVar19 = 0;
  goto LAB_00109832;
LAB_001089e0:
  plVar26 = (long *)((long)plVar37 + 2);
  if (plVar1 < plVar26) goto LAB_001082e7;
  goto LAB_0010860d;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {   int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}